

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O2

int av1_cost_coeffs_txb(MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
                       TXB_CTX *txb_ctx,int reduced_tx_set_used)

{
  TX_CLASS tx_class;
  char cVar1;
  ushort eob;
  short sVar2;
  int16_t *scan;
  uint level;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  undefined7 in_register_00000009;
  int iVar8;
  int sign01;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  LV_MAP_COEFF_COST *txb_costs;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  tran_low_t *ptVar17;
  ulong uVar18;
  bool bVar19;
  uint8_t levels_buf [1312];
  int8_t local_1038 [4104];
  
  eob = x->plane[plane].eobs[block];
  uVar18 = CONCAT71(in_register_00000009,tx_size) & 0xffffffff;
  uVar11 = (uint)""[uVar18] + (uint)""[uVar18] + 1 >> 1 & 0xff;
  bVar19 = plane != 0;
  txb_costs = (x->coeff_costs).coeff_costs[uVar11] + bVar19;
  if (eob == 0) {
    return (x->coeff_costs).coeff_costs[uVar11][bVar19].txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }
  uVar10 = (ulong)tx_type;
  tx_class = ""[uVar10];
  ptVar17 = x->plane[plane].qcoeff + (block << 4);
  iVar8 = txb_ctx->txb_skip_ctx;
  iVar3 = get_txb_bhl(tx_size);
  iVar4 = get_txb_wide(tx_size);
  iVar5 = get_txb_high(tx_size);
  scan = *(int16_t **)
          ((long)&av1_scan_orders[0][tx_type].scan +
          (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_size) << 8));
  cVar1 = ""[uVar18];
  iVar8 = txb_costs->txb_skip_cost[iVar8][0];
  (*av1_txb_init_levels)(ptVar17,iVar4,iVar5,levels_buf);
  iVar4 = get_tx_type_cost(x,&x->e_mbd,plane,tx_size,tx_type,reduced_tx_set_used);
  iVar5 = get_eob_cost((uint)eob,(x->coeff_costs).eob_costs[cVar1] + bVar19,txb_costs,tx_class);
  av1_get_nz_map_contexts_sse2(levels_buf,scan,eob,tx_size,tx_class,local_1038);
  uVar6 = eob - 1;
  sVar2 = scan[uVar6];
  uVar12 = ptVar17[sVar2];
  level = -uVar12;
  if (0 < (int)uVar12) {
    level = uVar12;
  }
  uVar18 = 3;
  if (level < 3) {
    uVar18 = (ulong)level;
  }
  iVar8 = iVar5 + iVar4 + iVar8 + txb_costs->base_eob_cost[(long)local_1038[sVar2] + -1][uVar18 + 2]
  ;
  bVar7 = (byte)iVar3;
  if (uVar12 != 0) {
    if (2 < level) {
      iVar4 = (int)sVar2 >> (bVar7 & 0x1f);
      iVar3 = iVar4 << (bVar7 & 0x1f);
      if (sVar2 == 0) {
        lVar16 = 0;
      }
      else {
        lVar16 = 7;
        if (((1 < iVar4 || 1 < sVar2 - iVar3) || 9 < tx_type) &&
           (((0xa800UL >> (uVar10 & 0x3f) & 1) == 0 || (iVar4 != 0)))) {
          if (sVar2 != iVar3) {
            lVar16 = 0xe;
          }
          if ((0x5400UL >> (uVar10 & 0x3f) & 1) == 0) {
            lVar16 = 0xe;
          }
        }
      }
      iVar3 = get_br_cost(level,(x->coeff_costs).coeff_costs[uVar11][bVar19].lps_cost[lVar16]);
      iVar8 = iVar8 + iVar3;
    }
    if (uVar6 == 0) {
      return iVar8 + txb_costs->dc_sign_cost[txb_ctx->dc_sign_ctx][uVar12 >> 0x1f];
    }
    iVar8 = iVar8 + 0x200;
  }
  iVar4 = 1 << (bVar7 & 0x1f);
  uVar18 = (ulong)(eob - 2);
  iVar3 = iVar4 * 2 + 8;
  iVar4 = iVar4 + 4;
  lVar16 = uVar18 << 0x20;
  for (; uVar10 = 3, 0 < (int)uVar18; uVar18 = uVar18 - 1) {
    sVar2 = scan[uVar18];
    uVar6 = ptVar17[sVar2];
    uVar12 = -uVar6;
    if (0 < (int)uVar6) {
      uVar12 = uVar6;
    }
    if (uVar12 < 3) {
      uVar10 = (ulong)uVar12;
    }
    iVar8 = iVar8 + (x->coeff_costs).coeff_costs[uVar11][bVar19].base_cost[local_1038[sVar2]]
                    [uVar10];
    if ((uVar6 != 0) && (iVar8 = iVar8 + 0x200, 2 < uVar12)) {
      iVar9 = (int)sVar2 >> (bVar7 & 0x1f);
      iVar13 = iVar9 << (bVar7 & 0x1f);
      iVar5 = sVar2 - iVar13;
      iVar14 = iVar9 * iVar4 + iVar5;
      uVar6 = (uint)levels_buf[iVar4 + iVar14] + (uint)levels_buf[(long)iVar14 + 1];
      if (tx_class == '\x02') {
        uVar6 = uVar6 + levels_buf[(long)iVar14 + 2] + 1 >> 1;
        if (5 < uVar6) {
          uVar6 = 6;
        }
        if (sVar2 != 0) {
          if (sVar2 != iVar13) goto LAB_0021ccc5;
LAB_0021ccec:
          uVar6 = uVar6 + 7;
        }
      }
      else {
        if (tx_class == '\x01') {
          uVar6 = uVar6 + levels_buf[iVar14 + iVar3] + 1 >> 1;
          if (5 < uVar6) {
            uVar6 = 6;
          }
          if (sVar2 == 0) goto LAB_0021ccf4;
          if (iVar9 == 0) goto LAB_0021ccec;
        }
        else if (tx_class == '\0') {
          uVar6 = uVar6 + levels_buf[(long)(iVar4 + iVar14) + 1] + 1 >> 1;
          if (5 < uVar6) {
            uVar6 = 6;
          }
          if (sVar2 == 0) goto LAB_0021ccf4;
          if (iVar9 < 2 && iVar5 < 2) goto LAB_0021ccec;
        }
LAB_0021ccc5:
        uVar6 = uVar6 + 0xe;
      }
LAB_0021ccf4:
      iVar5 = get_br_cost(uVar12,(x->coeff_costs).coeff_costs[uVar11][bVar19].lps_cost[uVar6]);
      iVar8 = iVar8 + iVar5;
    }
    lVar16 = lVar16 + -0x100000000;
  }
  sVar2 = *(short *)((long)scan + (lVar16 >> 0x1f));
  uVar6 = ptVar17[sVar2];
  uVar12 = -uVar6;
  if (0 < (int)uVar6) {
    uVar12 = uVar6;
  }
  uVar18 = 3;
  if (uVar12 < 3) {
    uVar18 = (ulong)uVar12;
  }
  iVar8 = iVar8 + (x->coeff_costs).coeff_costs[uVar11][bVar19].base_cost[local_1038[sVar2]][uVar18];
  if (uVar6 == 0) {
    return iVar8;
  }
  iVar8 = iVar8 + txb_costs->dc_sign_cost[txb_ctx->dc_sign_ctx][uVar6 >> 0x1f];
  if (uVar12 < 3) {
    return iVar8;
  }
  iVar9 = (int)sVar2 >> (bVar7 & 0x1f);
  iVar14 = iVar9 << (bVar7 & 0x1f);
  iVar13 = sVar2 - iVar14;
  iVar15 = iVar9 * iVar4 + iVar13;
  iVar5 = (uint)levels_buf[iVar4 + iVar15] + (uint)levels_buf[(long)iVar15 + 1];
  if (tx_class == '\x02') {
    uVar6 = iVar5 + (uint)levels_buf[(long)iVar15 + 2] + 1 >> 1;
    uVar18 = 6;
    if (uVar6 < 6) {
      uVar18 = (ulong)uVar6;
    }
    iVar5 = (int)uVar18;
    if (sVar2 == 0) goto LAB_0021ce7c;
    if (sVar2 == iVar14) {
LAB_0021ce78:
      uVar18 = (ulong)(iVar5 + 7);
      goto LAB_0021ce7c;
    }
  }
  else if (tx_class == '\x01') {
    uVar6 = iVar5 + (uint)levels_buf[iVar15 + iVar3] + 1 >> 1;
    uVar18 = 6;
    if (uVar6 < 6) {
      uVar18 = (ulong)uVar6;
    }
    iVar5 = (int)uVar18;
    if (sVar2 == 0) goto LAB_0021ce7c;
    if (iVar9 == 0) goto LAB_0021ce78;
  }
  else if (tx_class == '\0') {
    uVar6 = iVar5 + (uint)levels_buf[(long)(iVar4 + iVar15) + 1] + 1 >> 1;
    uVar18 = 6;
    if (uVar6 < 6) {
      uVar18 = (ulong)uVar6;
    }
    iVar5 = (int)uVar18;
    if (sVar2 == 0) goto LAB_0021ce7c;
    if (iVar9 < 2 && iVar13 < 2) goto LAB_0021ce78;
  }
  uVar18 = (ulong)(iVar5 + 0xe);
LAB_0021ce7c:
  iVar3 = get_br_cost(uVar12,(x->coeff_costs).coeff_costs[uVar11][bVar19].lps_cost[uVar18]);
  return iVar8 + iVar3;
}

Assistant:

int av1_cost_coeffs_txb(const MACROBLOCK *x, const int plane, const int block,
                        const TX_SIZE tx_size, const TX_TYPE tx_type,
                        const TXB_CTX *const txb_ctx, int reduced_tx_set_used) {
  const struct macroblock_plane *p = &x->plane[plane];
  const int eob = p->eobs[block];
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const LV_MAP_COEFF_COST *const coeff_costs =
      &x->coeff_costs.coeff_costs[txs_ctx][plane_type];
  if (eob == 0) {
    return coeff_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }

  const MACROBLOCKD *const xd = &x->e_mbd;
  const TX_CLASS tx_class = tx_type_to_class[tx_type];

  return warehouse_efficients_txb(x, plane, block, tx_size, txb_ctx, p, eob,
                                  plane_type, coeff_costs, xd, tx_type,
                                  tx_class, reduced_tx_set_used);
}